

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O1

value * helics::fileops::loadTomlStr(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  spec s;
  istringstream tstring;
  undefined1 *puVar1;
  undefined8 in_stack_fffffffffffffe28;
  long in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  semantic_version local_1c0;
  spec local_1b0;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream(local_198,(string *)tomlString,_S_in);
  puVar1 = &stack0xfffffffffffffe30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe20,"unknown file","");
  local_1c0.major = 1;
  local_1c0.minor = 0;
  local_1c0.patch = 0;
  toml::spec::spec(&local_1b0,&local_1c0);
  fname._M_string_length._0_4_ = local_1b0.version.patch;
  fname._M_string_length._4_1_ = local_1b0.v1_1_0_allow_control_characters_in_comments;
  fname._M_string_length._5_1_ = local_1b0.v1_1_0_allow_newlines_in_inline_tables;
  fname._M_string_length._6_1_ = local_1b0.v1_1_0_allow_trailing_comma_in_inline_tables;
  fname._M_string_length._7_1_ = local_1b0.v1_1_0_allow_non_english_in_bare_keys;
  fname._M_dataplus._M_p = (pointer)local_1b0.version._0_8_;
  fname.field_2._0_1_ = local_1b0.v1_1_0_add_escape_sequence_e;
  fname.field_2._1_1_ = local_1b0.v1_1_0_add_escape_sequence_x;
  fname.field_2._2_1_ = local_1b0.v1_1_0_make_seconds_optional;
  fname.field_2._3_1_ = local_1b0.ext_hex_float;
  fname.field_2._4_1_ = local_1b0.ext_num_suffix;
  fname.field_2._5_1_ = local_1b0.ext_null_value;
  fname.field_2._6_2_ = local_1b0._22_2_;
  fname.field_2._8_8_ = puVar1;
  s.version.patch = (int)in_stack_fffffffffffffe30;
  s.v1_1_0_allow_control_characters_in_comments =
       (bool)(char)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  s.v1_1_0_allow_newlines_in_inline_tables = (bool)(char)((ulong)in_stack_fffffffffffffe30 >> 0x28);
  s.v1_1_0_allow_trailing_comma_in_inline_tables =
       (bool)(char)((ulong)in_stack_fffffffffffffe30 >> 0x30);
  s.v1_1_0_allow_non_english_in_bare_keys = (bool)(char)((ulong)in_stack_fffffffffffffe30 >> 0x38);
  s.version.major = (int)in_stack_fffffffffffffe28;
  s.version.minor = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  s.v1_1_0_add_escape_sequence_e = (bool)(char)in_stack_fffffffffffffe38;
  s.v1_1_0_add_escape_sequence_x = (bool)(char)((ulong)in_stack_fffffffffffffe38 >> 8);
  s.v1_1_0_make_seconds_optional = (bool)(char)((ulong)in_stack_fffffffffffffe38 >> 0x10);
  s.ext_hex_float = (bool)(char)((ulong)in_stack_fffffffffffffe38 >> 0x18);
  s.ext_num_suffix = (bool)(char)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  s.ext_null_value = (bool)(char)((ulong)in_stack_fffffffffffffe38 >> 0x28);
  s._22_2_ = (short)((ulong)in_stack_fffffffffffffe38 >> 0x30);
  toml::parse<toml::type_config>(__return_storage_ptr__,(istream *)local_198,fname,s);
  if (puVar1 != &stack0xfffffffffffffe30) {
    operator_delete(puVar1,in_stack_fffffffffffffe30 + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

toml::value loadTomlStr(const std::string& tomlString)
{
    try {
        std::istringstream tstring(tomlString);
        toml::value doc = toml::parse(tstring);
        return doc;
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}